

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getopt.c
# Opt level: O0

int getopt(int ___argc,char **___argv,char *__shortopts)

{
  char *pcVar1;
  undefined8 in_R8;
  undefined8 in_R9;
  char *oli;
  char *ostr_local;
  char **nargv_local;
  int nargc_local;
  
  if ((optreset != 0) || (*getopt::place == '\0')) {
    optreset = 0;
    if ((___argc <= optind) || (pcVar1 = ___argv[optind], *pcVar1 != '-')) {
      getopt::place = "";
      optreset = 0;
      return -1;
    }
    getopt::place = pcVar1;
    if ((pcVar1[1] != '\0') && (getopt::place = pcVar1 + 1, pcVar1[1] == '-')) {
      getopt::place = "";
      optind = optind + 1;
      optreset = 0;
      return -1;
    }
  }
  pcVar1 = getopt::place + 1;
  optopt = (int)*getopt::place;
  getopt::place = pcVar1;
  if ((optopt == 0x3a) || (pcVar1 = strchr(__shortopts,optopt), pcVar1 == (char *)0x0)) {
    if (optopt == 0x2d) {
      nargv_local._4_4_ = -1;
    }
    else {
      if (*getopt::place == '\0') {
        optind = optind + 1;
      }
      if (((opterr != 0) && (*__shortopts != ':')) && (optopt != 0x3f)) {
        fprintf(_stderr,"%s: illegal option -- %c\n",___progname,(ulong)(uint)optopt);
      }
      nargv_local._4_4_ = 0x3f;
    }
  }
  else {
    if (pcVar1[1] == ':') {
      if (*getopt::place == '\0') {
        optind = optind + 1;
        if (___argc <= optind) {
          getopt::place = "";
          if (*__shortopts == ':') {
            return 0x3a;
          }
          if (opterr != 0) {
            fprintf(_stderr,"%s: option requires an argument -- %c\n",___progname,
                    (ulong)(uint)optopt,in_R8,in_R9,pcVar1 + 1);
          }
          return 0x3f;
        }
        optarg = ___argv[optind];
      }
      else {
        optarg = getopt::place;
      }
      getopt::place = "";
      optind = optind + 1;
    }
    else {
      optarg = (char *)0x0;
      if (*getopt::place == '\0') {
        optind = optind + 1;
      }
    }
    nargv_local._4_4_ = optopt;
  }
  return nargv_local._4_4_;
}

Assistant:

int
getopt(int nargc, char * const *nargv, char * ostr)
  /*int nargc;
	char * const *nargv;
  const char *ostr;*/
{
	extern char *__progname;
	static char *place = EMSG;		/* option letter processing */
	char *oli;				/* option letter list index */

	if (optreset || !*place) {		/* update scanning pointer */
		optreset = 0;
		if (optind >= nargc || *(place = nargv[optind]) != '-') {
			place = EMSG;
			return (-1);
		}
		if (place[1] && *++place == '-') {	/* found "--" */
			++optind;
			place = EMSG;
			return (-1);
		}
	}					/* option letter okay? */
	if ((optopt = (int)*place++) == (int)':' ||
	    !(oli = strchr(ostr, optopt))) {
		/*
		 * if the user didn't specify '-' as an option,
		 * assume it means -1.
		 */
		if (optopt == (int)'-')
			return (-1);
		if (!*place)
			++optind;
		if (opterr && *ostr != ':' && optopt != BADCH)
			(void)fprintf(stderr,
			    "%s: illegal option -- %c\n", __progname, optopt);
		return (BADCH);
	}
	if (*++oli != ':') {			/* don't need argument */
		optarg = NULL;
		if (!*place)
			++optind;
	}
	else {					/* need an argument */
		if (*place)			/* no white space */
			optarg = place;
		else if (nargc <= ++optind) {	/* no arg */
			place = EMSG;
			if (*ostr == ':')
				return (BADARG);
			if (opterr)
				(void)fprintf(stderr,
				    "%s: option requires an argument -- %c\n",
				    __progname, optopt);
			return (BADCH);
		}
	 	else				/* white space */
			optarg = nargv[optind];
		place = EMSG;
		++optind;
	}
	return (optopt);			/* dump back option letter */
}